

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConeShape.cpp
# Opt level: O3

void __thiscall cbtConeShapeZ::cbtConeShapeZ(cbtConeShapeZ *this,cbtScalar radius,cbtScalar height)

{
  undefined1 auVar1 [16];
  
  cbtConvexInternalShape::cbtConvexInternalShape((cbtConvexInternalShape *)this);
  (this->super_cbtConeShape).m_radius = radius;
  (this->super_cbtConeShape).m_height = height;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 0xb;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(height * height)),ZEXT416((uint)radius),
                           ZEXT416((uint)radius));
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  *(float *)&(this->super_cbtConeShape).super_cbtConvexInternalShape.field_0x44 =
       radius / auVar1._0_4_;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_00b49e18;
  (this->super_cbtConeShape).m_coneIndices[0] = 0;
  (this->super_cbtConeShape).m_coneIndices[1] = 2;
  (this->super_cbtConeShape).m_coneIndices[2] = 1;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[0] =
       radius;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[2] =
       height;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[1] =
       radius;
  return;
}

Assistant:

cbtConeShapeZ::cbtConeShapeZ(cbtScalar radius, cbtScalar height) : cbtConeShape(radius, height)
{
	setConeUpIndex(2);
}